

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O1

int Kf_ManComputeDelay(Kf_Man_t *p,int fEval)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  word *pwVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  
  if (fEval != 0) {
    pGVar3 = p->pGia;
    uVar8 = (ulong)(uint)pGVar3->nObjs;
    if ((0 < pGVar3->nObjs) && (pGVar4 = pGVar3->pObjs, pGVar4 != (Gia_Obj_t *)0x0)) {
      lVar9 = 0;
      do {
        uVar10 = *(uint *)(pGVar4 + lVar9);
        if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
          if ((int)uVar8 <= lVar9) goto LAB_0075e919;
          if (0 < pGVar3->pRefs[lVar9]) {
            if ((p->vCuts).nSize <= lVar9) goto LAB_0075e8bc;
            uVar10 = (p->vCuts).pArray[lVar9];
            pwVar5 = (p->pMem).pPages[(int)uVar10 >> ((byte)(p->pMem).nPageSize & 0x1f)];
            uVar10 = uVar10 & (p->pMem).uPageMask;
            lVar11 = (long)*(int *)((long)pwVar5 + (long)(int)uVar10 * 8 + 4);
            uVar1 = *(uint *)((long)pwVar5 + lVar11 * 4 + (long)(int)uVar10 * 8);
            if ((int)uVar1 < 1) {
              iVar7 = 1;
            }
            else {
              iVar7 = 0;
              lVar12 = 1;
              do {
                uVar13 = *(uint *)((long)pwVar5 + lVar12 * 4 + lVar11 * 4 + (long)(int)uVar10 * 8);
                if ((int)uVar13 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                uVar13 = uVar13 >> 1;
                if ((p->vTime).nSize <= (int)uVar13) goto LAB_0075e8bc;
                iVar2 = (p->vTime).pArray[uVar13];
                if (iVar7 <= iVar2) {
                  iVar7 = iVar2;
                }
                lVar12 = lVar12 + 1;
              } while ((ulong)uVar1 + 1 != lVar12);
              iVar7 = iVar7 + 1;
            }
            if ((p->vTime).nSize <= lVar9) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            (p->vTime).pArray[lVar9] = iVar7;
          }
        }
        lVar9 = lVar9 + 1;
        uVar8 = (ulong)pGVar3->nObjs;
      } while (lVar9 < (long)uVar8);
    }
  }
  pGVar3 = p->pGia;
  lVar9 = (long)pGVar3->vCos->nSize;
  if (lVar9 < 1) {
    iVar7 = 0;
  }
  else {
    lVar11 = 0;
    iVar7 = 0;
    do {
      iVar2 = pGVar3->vCos->pArray[lVar11];
      if (((long)iVar2 < 0) || (pGVar3->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar6 = pGVar3->pObjs;
      pGVar4 = pGVar6 + iVar2 + -(ulong)((uint)*(undefined8 *)(pGVar6 + iVar2) & 0x1fffffff);
      if ((pGVar4 < pGVar6) || (pGVar6 + pGVar3->nObjs <= pGVar4)) {
LAB_0075e919:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar10 = (int)((long)pGVar4 - (long)pGVar6 >> 2) * -0x55555555;
      if (pGVar3->pRefs[(int)uVar10] < 1) {
        __assert_fail("Gia_ObjRefNum(p->pGia, pObj) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                      ,0x385,"int Kf_ManComputeDelay(Kf_Man_t *, int)");
      }
      if (((int)uVar10 < 0) || ((p->vTime).nSize <= (int)uVar10)) {
LAB_0075e8bc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (p->vTime).pArray[uVar10 & 0x7fffffff];
      if (iVar7 <= iVar2) {
        iVar7 = iVar2;
      }
      lVar11 = lVar11 + 1;
    } while (lVar9 != lVar11);
  }
  return iVar7;
}

Assistant:

int Kf_ManComputeDelay( Kf_Man_t * p, int fEval )
{
    Gia_Obj_t * pObj; 
    int i, Delay = 0;
    if ( fEval )
    {
        Gia_ManForEachAnd( p->pGia, pObj, i )
            if ( Gia_ObjRefNum(p->pGia, pObj) > 0 )
                Vec_IntWriteEntry( &p->vTime, i, Kf_CutTime(p, Kf_ObjCutBest(p, i)) );
    }
    Gia_ManForEachCoDriver( p->pGia, pObj, i )
    {
        assert( Gia_ObjRefNum(p->pGia, pObj) > 0 );
        Delay = Abc_MaxInt( Delay, Kf_ObjTime(p, Gia_ObjId(p->pGia, pObj)) );
    }
    return Delay;
}